

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestlstm_var1.h
# Opt level: O0

vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> * __thiscall
cnn::ForestLSTMBuilder_var1::get_s(ForestLSTMBuilder_var1 *this,RNNPointer *i)

{
  bool bVar1;
  int *piVar2;
  const_reference this_00;
  RNNPointer *in_RDX;
  long *in_RSI;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_RDI;
  Expression my_h;
  iterator __end2;
  iterator __begin2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *__range2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ret;
  Expression *in_stack_ffffffffffffff48;
  Expression *this_01;
  value_type *in_stack_ffffffffffffff58;
  Expression local_78;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffff98;
  __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
  in_stack_ffffffffffffffa0;
  Expression local_44;
  undefined1 *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  piVar2 = RNNPointer::operator_cast_to_int_(in_RDX);
  if (*piVar2 == -1) {
    this_00 = (const_reference)(in_RSI + 0x2a);
  }
  else {
    in_stack_ffffffffffffff58 = (value_type *)(in_RSI + 0x1a);
    piVar2 = RNNPointer::operator_cast_to_int_(in_RDX);
    this_00 = std::
              vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
              ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                            *)in_stack_ffffffffffffff58,(long)*piVar2);
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98);
  this_01 = &local_44;
  RNNPointer::RNNPointer((RNNPointer *)this_01,in_RDX);
  (**(code **)(*in_RSI + 0x20))((undefined1 *)((long)&local_44.pg + 4),in_RSI,this_01);
  local_28 = (undefined1 *)((long)&local_44.pg + 4);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::begin
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffff48);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::end
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                             *)this_01,
                            (__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    __gnu_cxx::
    __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
    ::operator*((__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                 *)&stack0xffffffffffffffa0);
    in_stack_ffffffffffffff48 = &local_78;
    expr::Expression::Expression(this_01,in_stack_ffffffffffffff48);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
              (this_00,in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
    ::operator++((__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                  *)&stack0xffffffffffffffa0);
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::vector<Expression> get_s(RNNPointer i) const override {
    std::vector<Expression> ret = (i == -1 ? c0 : c[i]);
    for(auto my_h : get_h(i)) ret.push_back(my_h);
    return ret;
  }